

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allintra_vis.c
# Opt level: O0

void ext_rate_guided_quantization(AV1_COMP *cpi)

{
  int iVar1;
  long in_RDI;
  double scale;
  int mi_col;
  int mi_row;
  int c;
  int r;
  int rate_sum;
  int col_1;
  int row_1;
  int uniform_rate_sum;
  int fields_converted;
  float val;
  int col;
  int row;
  double ext_rate_sum;
  FILE *pfile;
  char *filename;
  int block_step;
  int mb_step;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  float local_34;
  int local_30;
  int local_2c;
  double local_28;
  FILE *local_20;
  char *local_18;
  undefined4 local_10;
  uint local_c;
  long local_8;
  
  local_c = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                  [*(byte *)(in_RDI + 0x9d5f8)];
  local_10 = 4;
  local_18 = *(char **)(in_RDI + 0x42788);
  local_8 = in_RDI;
  local_20 = fopen64(local_18,"r");
  if (local_20 != (FILE *)0x0) {
    local_28 = 0.0;
    for (local_2c = 0; local_2c < *(int *)(local_8 + 0x712d0); local_2c = local_2c + 4) {
      for (local_30 = 0; local_30 < *(int *)(local_8 + 0x712d4); local_30 = local_30 + 4) {
        iVar1 = __isoc99_fscanf(local_20,"%f",&local_34);
        if (iVar1 != 1) {
          fclose(local_20);
          return;
        }
        local_28 = (double)local_34 + local_28;
        *(double *)
         (*(long *)(local_8 + 0x9d5e8) +
         (long)((local_2c / (int)local_c) * *(int *)(local_8 + 0x712d4) + local_30 / (int)local_c) *
         8) = (double)local_34;
      }
    }
    fclose(local_20);
    local_3c = 0;
    for (local_40 = 0; local_40 < *(int *)(local_8 + 0x712d0); local_40 = local_40 + 4) {
      for (local_44 = 0; local_44 < *(int *)(local_8 + 0x712d4); local_44 = local_44 + 4) {
        local_48 = 0;
        for (local_4c = 0; local_4c < 4; local_4c = local_c + local_4c) {
          for (local_50 = 0; local_50 < 4; local_50 = local_c + local_50) {
            local_48 = *(int *)(*(long *)(local_8 + 0x9d5e0) +
                               (long)(((local_40 + local_4c) / (int)local_c) *
                                      *(int *)(local_8 + 0x712d4) +
                                     (local_44 + local_50) / (int)local_c) * 4) + local_48;
          }
        }
        local_3c = local_48 + local_3c;
      }
    }
    *(double *)(local_8 + 0x9d5f0) = (double)local_3c / local_28;
  }
  return;
}

Assistant:

static void ext_rate_guided_quantization(AV1_COMP *cpi) {
  // Calculation uses 8x8.
  const int mb_step = mi_size_wide[cpi->weber_bsize];
  // Accumulate to 16x16, step size is in the unit of mi.
  const int block_step = 4;

  const char *filename = cpi->oxcf.rate_distribution_info;
  FILE *pfile = fopen(filename, "r");
  if (pfile == NULL) {
    assert(pfile != NULL);
    return;
  }

  double ext_rate_sum = 0.0;
  for (int row = 0; row < cpi->frame_info.mi_rows; row += block_step) {
    for (int col = 0; col < cpi->frame_info.mi_cols; col += block_step) {
      float val;
      const int fields_converted = fscanf(pfile, "%f", &val);
      if (fields_converted != 1) {
        assert(fields_converted == 1);
        fclose(pfile);
        return;
      }
      ext_rate_sum += val;
      cpi->ext_rate_distribution[(row / mb_step) * cpi->frame_info.mi_cols +
                                 (col / mb_step)] = val;
    }
  }
  fclose(pfile);

  int uniform_rate_sum = 0;
  for (int row = 0; row < cpi->frame_info.mi_rows; row += block_step) {
    for (int col = 0; col < cpi->frame_info.mi_cols; col += block_step) {
      int rate_sum = 0;
      for (int r = 0; r < block_step; r += mb_step) {
        for (int c = 0; c < block_step; c += mb_step) {
          const int mi_row = row + r;
          const int mi_col = col + c;
          rate_sum += cpi->prep_rate_estimates[(mi_row / mb_step) *
                                                   cpi->frame_info.mi_cols +
                                               (mi_col / mb_step)];
        }
      }
      uniform_rate_sum += rate_sum;
    }
  }

  const double scale = uniform_rate_sum / ext_rate_sum;
  cpi->ext_rate_scale = scale;
}